

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_type.cc
# Opt level: O0

void * asn1_type_value_as_pointer(ASN1_TYPE *a)

{
  int iVar1;
  ASN1_TYPE *a_local;
  
  iVar1 = a->type;
  if (iVar1 == 1) {
    a_local = (ASN1_TYPE *)0x0;
    if ((a->value).boolean != 0) {
      a_local = (ASN1_TYPE *)0xff;
    }
  }
  else if (iVar1 == 5) {
    a_local = (ASN1_TYPE *)0x0;
  }
  else if (iVar1 == 6) {
    a_local = (ASN1_TYPE *)(a->value).asn1_string;
  }
  else {
    a_local = (ASN1_TYPE *)(a->value).asn1_string;
  }
  return a_local;
}

Assistant:

const void *asn1_type_value_as_pointer(const ASN1_TYPE *a) {
  switch (a->type) {
    case V_ASN1_NULL:
      return NULL;
    case V_ASN1_BOOLEAN:
      return a->value.boolean ? (void *)0xff : NULL;
    case V_ASN1_OBJECT:
      return a->value.object;
    default:
      return a->value.asn1_string;
  }
}